

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_int8.h
# Opt level: O0

void ncnn::convdw3x3s2_int8_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Option *opt)

{
  char *pcVar1;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  int sum;
  int remain;
  int i;
  char *r2;
  char *r1;
  char *r0;
  char *img0;
  int *outptr;
  char *kernel0;
  Mat out;
  int p;
  char *kernel;
  int tailstep;
  int outch;
  int outh;
  int outw;
  int w;
  Mat *this;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  int in_stack_ffffffffffffff00;
  int iVar2;
  int in_stack_ffffffffffffff04;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  Mat local_d0;
  char *local_98;
  int *local_90;
  char *local_88;
  Mat local_80;
  int local_44;
  char *local_40;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  local_24 = *(int *)(in_RDI + 0x24);
  local_28 = *(int *)(in_RSI + 0x24);
  local_2c = *(int *)(in_RSI + 0x28);
  local_30 = *(int *)(in_RSI + 0x2c);
  local_34 = local_24 * 2 + local_28 * -2;
  local_40 = Mat::operator_cast_to_signed_char_(in_RDX);
  for (local_44 = 0; local_44 < local_30; local_44 = local_44 + 1) {
    this = &local_80;
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                 (int)((ulong)this >> 0x20));
    Mat::fill((Mat *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
              in_stack_fffffffffffffefc);
    local_88 = local_40 + local_44 * 9;
    local_90 = Mat::operator_cast_to_int_(this);
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                 (int)((ulong)this >> 0x20));
    pcVar1 = Mat::operator_cast_to_signed_char_(&local_d0);
    Mat::~Mat((Mat *)0x145837);
    local_f0 = pcVar1 + local_24;
    local_f8 = pcVar1 + (local_24 << 1);
    local_e8 = pcVar1;
    for (in_stack_ffffffffffffff04 = 0; iVar2 = local_28, in_stack_ffffffffffffff04 < local_2c;
        in_stack_ffffffffffffff04 = in_stack_ffffffffffffff04 + 1) {
      for (; 0 < iVar2; iVar2 = iVar2 + -1) {
        in_stack_fffffffffffffefc =
             (int)local_f8[2] * (int)local_88[8] +
             (int)local_f8[1] * (int)local_88[7] +
             (int)*local_f8 * (int)local_88[6] +
             (int)local_f0[2] * (int)local_88[5] +
             (int)local_f0[1] * (int)local_88[4] +
             (int)*local_f0 * (int)local_88[3] +
             (int)local_e8[2] * (int)local_88[2] +
             (int)local_e8[1] * (int)local_88[1] + (int)*local_e8 * (int)*local_88;
        *local_90 = in_stack_fffffffffffffefc + *local_90;
        local_e8 = local_e8 + 2;
        local_f0 = local_f0 + 2;
        local_f8 = local_f8 + 2;
        local_90 = local_90 + 1;
      }
      local_e8 = local_e8 + local_34;
      local_f0 = local_f0 + local_34;
      local_f8 = local_f8 + local_34;
      in_stack_ffffffffffffff00 = iVar2;
    }
    local_98 = pcVar1;
    Mat::~Mat((Mat *)0x145ab7);
  }
  return;
}

Assistant:

static void convdw3x3s2_int8_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, const Option& opt)
{
    int w = bottom_blob.w;
    //int h = bottom_blob.h;
    //int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int tailstep = w - 2 * outw + w;

    const signed char *kernel = _kernel;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);
        out.fill(0);

        const signed char *kernel0 = (const signed char *)kernel + p * 9;

        int *outptr = out;

        const signed char *img0 = bottom_blob.channel(p);

        const signed char *r0 = img0;
        const signed char *r1 = img0 + w;
        const signed char *r2 = img0 + w * 2;

        int i = 0;

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                int sum = 0;

                sum += (int)r0[0] * (int)kernel0[0];
                sum += (int)r0[1] * (int)kernel0[1];
                sum += (int)r0[2] * (int)kernel0[2];
                sum += (int)r1[0] * (int)kernel0[3];
                sum += (int)r1[1] * (int)kernel0[4];
                sum += (int)r1[2] * (int)kernel0[5];
                sum += (int)r2[0] * (int)kernel0[6];
                sum += (int)r2[1] * (int)kernel0[7];
                sum += (int)r2[2] * (int)kernel0[8];

                *outptr += sum;

                r0 += 2;
                r1 += 2;
                r2 += 2;
                outptr++;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}